

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O3

Iterator __thiscall List<String>::insert(List<String> *this,Iterator *position,String *value)

{
  Item *pIVar1;
  Item *pIVar2;
  ItemBlock *pIVar3;
  Iterator *pIVar4;
  Item *this_00;
  
  this_00 = this->freeItem;
  if (this_00 == (Item *)0x0) {
    pIVar3 = (ItemBlock *)operator_new__(0xe8);
    pIVar3->next = this->blocks;
    this->blocks = pIVar3;
    pIVar3[6].next = (ItemBlock *)0x0;
    pIVar3[0xd].next = pIVar3 + 1;
    pIVar3[0x14].next = pIVar3 + 8;
    pIVar3[0x1b].next = pIVar3 + 0xf;
    this_00 = (Item *)(pIVar3 + 0x16);
    this->freeItem = this_00;
  }
  String::String(&this_00->value,value);
  this->freeItem = this_00->prev;
  pIVar1 = position->item;
  pIVar2 = pIVar1->prev;
  pIVar4 = (Iterator *)&pIVar2->next;
  if (pIVar2 == (Item *)0x0) {
    pIVar4 = &this->_begin;
  }
  this_00->prev = pIVar2;
  pIVar4->item = this_00;
  this_00->next = pIVar1;
  pIVar1->prev = this_00;
  this->_size = this->_size + 1;
  return (Iterator)this_00;
}

Assistant:

Iterator insert(const Iterator& position, const T& value)
  {
    Item* item = freeItem;
    if(!item)
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
      {
        i->prev = item;
        item = i;
      }
      freeItem = item;
    }

    new(item) Item(value);
    freeItem = item->prev;

    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }